

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O0

string * __thiscall TileWire::toString_abi_cxx11_(TileWire *this)

{
  const_reference pvVar1;
  long in_RSI;
  string *in_RDI;
  
  if (*(int *)(in_RSI + 0x164) == 0) {
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&WIRE_SYMBOL_TABLE_abi_cxx11_,
                          (long)(*(int *)(in_RSI + 8) * 3 + *(int *)(in_RSI + 0x168) + -1));
    std::__cxx11::string::string((string *)in_RDI,(string *)pvVar1);
  }
  else if (*(int *)(in_RSI + 0x164) < 3) {
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&WIRE_SYMBOL_TABLE_abi_cxx11_,
                          (long)(*(int *)(in_RSI + 0x164) * 0xc + *(int *)(in_RSI + 8) * 3 +
                                 *(int *)(in_RSI + 0x168) + -7));
    std::__cxx11::string::string((string *)in_RDI,(string *)pvVar1);
  }
  else if (*(int *)(in_RSI + 0x164) == 3) {
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&WIRE_SYMBOL_TABLE_abi_cxx11_,(long)(*(int *)(in_RSI + 0x168) + 0x1d));
    std::__cxx11::string::string((string *)in_RDI,(string *)pvVar1);
  }
  else {
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&WIRE_SYMBOL_TABLE_abi_cxx11_,
                          (long)(*(int *)(in_RSI + 0x168) + 0x20 +
                                (*(int *)(in_RSI + 0x16c) + -1) * 3));
    std::__cxx11::string::string((string *)in_RDI,(string *)pvVar1);
  }
  return in_RDI;
}

Assistant:

string TileWire::toString() const {
    if (_type == STRAIGHT) {
        return WIRE_SYMBOL_TABLE[_direction * 3 + _state1 - 1];
    } else if (_type < JUNCTION) {
        return WIRE_SYMBOL_TABLE[-6 + _type * 12 + _direction * 3 + _state1 - 1];
    } else if (_type == JUNCTION) {
        return WIRE_SYMBOL_TABLE[30 + _state1 - 1];
    } else {
        return WIRE_SYMBOL_TABLE[33 + _state1 - 1 + (_state2 - 1) * 3];
    }
}